

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O0

int ffgcdw(fitsfile *fptr,int colnum,int *width,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  int local_13c;
  long lStack_138;
  int gstatus;
  long rwidth;
  long repeat;
  double dStack_120;
  int typecode;
  double tscale;
  int scaled;
  int tstatus;
  int hdutype;
  int tcode;
  char dispfmt [20];
  char local_e8 [8];
  char keyname [75];
  char message [81];
  char *cptr;
  tcolumn *colptr;
  int *status_local;
  int *width_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
      snprintf(keyname + 0x48,0x51,"Specified column number is out of range: %d",(ulong)(uint)colnum
              );
      ffpmsg(keyname + 0x48);
      *status = 0x12e;
      fptr_local._4_4_ = 0x12e;
    }
    else {
      tstatus = fptr->Fptr->tableptr[colnum + -1].tdatatype;
      if (tstatus < 1) {
        tstatus = -tstatus;
      }
      ffkeyn("TDISP",colnum,local_e8,status);
      *width = 0;
      tscale._4_4_ = 0;
      iVar1 = ffgkys(fptr,local_e8,(char *)&hdutype,(char *)0x0,(int *)((long)&tscale + 4));
      if (iVar1 == 0) {
        for (unique0x00004880 = &hdutype; (char)*stack0xffffffffffffffc0 == ' ';
            register0x00000000 = (int *)((long)stack0xffffffffffffffc0 + 1)) {
        }
        if (((((((char)*stack0xffffffffffffffc0 == 'A') || ((char)*stack0xffffffffffffffc0 == 'a'))
              || ((char)*stack0xffffffffffffffc0 == 'I')) ||
             ((((char)*stack0xffffffffffffffc0 == 'i' || ((char)*stack0xffffffffffffffc0 == 'O')) ||
              (((char)*stack0xffffffffffffffc0 == 'o' ||
               (((char)*stack0xffffffffffffffc0 == 'Z' || ((char)*stack0xffffffffffffffc0 == 'z'))))
              )))) || ((char)*stack0xffffffffffffffc0 == 'F')) ||
           (((((char)*stack0xffffffffffffffc0 == 'f' || ((char)*stack0xffffffffffffffc0 == 'E')) ||
             ((char)*stack0xffffffffffffffc0 == 'e')) ||
            ((((char)*stack0xffffffffffffffc0 == 'D' || ((char)*stack0xffffffffffffffc0 == 'd')) ||
             (((char)*stack0xffffffffffffffc0 == 'G' || ((char)*stack0xffffffffffffffc0 == 'g'))))))
           )) {
          while( true ) {
            ppuVar2 = __ctype_b_loc();
            bVar3 = false;
            if (((*ppuVar2)[(int)(char)*stack0xffffffffffffffc0] & 0x800) == 0) {
              bVar3 = (char)*stack0xffffffffffffffc0 != '\0';
            }
            if (!bVar3) break;
            register0x00000000 = (int *)((long)stack0xffffffffffffffc0 + 1);
          }
          iVar1 = atoi((char *)stack0xffffffffffffffc0);
          *width = iVar1;
          if (0x52 < tstatus) {
            *width = *width * 2 + 3;
          }
        }
      }
      if (*width == 0) {
        ffkeyn("TFORM",colnum,local_e8,status);
        ffgkys(fptr,local_e8,(char *)&hdutype,(char *)0x0,status);
        ffkeyn("TSCAL",colnum,local_e8,status);
        tscale._4_4_ = 0;
        tscale._0_4_ = 0;
        iVar1 = ffgkyd(fptr,local_e8,&stack0xfffffffffffffee0,(char *)0x0,(int *)((long)&tscale + 4)
                      );
        if ((iVar1 == 0) && ((dStack_120 != 1.0 || (NAN(dStack_120))))) {
          tscale._0_4_ = 1;
        }
        if ((tscale._0_4_ == 0) || (0x15 < tstatus)) {
          if ((tscale._0_4_ == 0) || (tstatus != 0x29)) {
            if ((tscale._0_4_ == 0) || (tstatus != 0x51)) {
              ffghdt(fptr,&scaled,status);
              if (scaled == 1) {
                unique0x00004880 = &hdutype;
                while( true ) {
                  ppuVar2 = __ctype_b_loc();
                  bVar3 = false;
                  if (((*ppuVar2)[(int)(char)*stack0xffffffffffffffc0] & 0x800) == 0) {
                    bVar3 = (char)*stack0xffffffffffffffc0 != '\0';
                  }
                  if (!bVar3) break;
                  register0x00000000 = (int *)((long)stack0xffffffffffffffc0 + 1);
                }
                iVar1 = atoi((char *)stack0xffffffffffffffc0);
                *width = iVar1;
              }
              else if (tstatus == 1) {
                *width = 8;
              }
              else if (tstatus == 0xb) {
                *width = 4;
              }
              else if (tstatus == 0x15) {
                *width = 6;
              }
              else if (tstatus == 0x29) {
                *width = 0xb;
              }
              else if (tstatus == 0x51) {
                *width = 0x14;
              }
              else if (tstatus == 0x2a) {
                *width = 0xe;
              }
              else if (tstatus == 0x52) {
                *width = 0x17;
              }
              else if (tstatus == 0x53) {
                *width = 0x1f;
              }
              else if (tstatus == 0xa3) {
                *width = 0x31;
              }
              else if (tstatus == 0xe) {
                *width = 1;
              }
              else if (tstatus == 0x10) {
                rwidth = 0;
                lStack_138 = 0;
                local_13c = 0;
                iVar1 = ffgtcl(fptr,colnum,(int *)((long)&repeat + 4),&rwidth,
                               &stack0xfffffffffffffec8,&local_13c);
                if (((iVar1 == 0) && (0 < lStack_138)) && (lStack_138 < rwidth)) {
                  *width = (int)lStack_138;
                }
                else {
                  unique0x00004880 = &hdutype;
                  while( true ) {
                    ppuVar2 = __ctype_b_loc();
                    bVar3 = false;
                    if (((*ppuVar2)[(int)(char)*stack0xffffffffffffffc0] & 0x800) == 0) {
                      bVar3 = (char)*stack0xffffffffffffffc0 != '\0';
                    }
                    if (!bVar3) break;
                    register0x00000000 = (int *)((long)stack0xffffffffffffffc0 + 1);
                  }
                  iVar1 = atoi((char *)stack0xffffffffffffffc0);
                  *width = iVar1;
                }
                if (*width < 1) {
                  *width = 1;
                }
              }
            }
            else {
              *width = 0x17;
            }
          }
          else {
            *width = 0x17;
          }
        }
        else {
          *width = 0xe;
        }
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcdw( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column (1 = 1st col)      */
            int  *width,      /* O - display width                       */
            int  *status)     /* IO - error status                           */
/*
  Get Column Display Width.
*/
{
    tcolumn *colptr;
    char *cptr;
    char message[FLEN_ERRMSG], keyname[FLEN_KEYWORD], dispfmt[20];
    int tcode, hdutype, tstatus, scaled;
    double tscale;

    if (*status > 0)  /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = abs(colptr->tdatatype);

    /* use the TDISPn keyword if it exists */
    ffkeyn("TDISP", colnum, keyname, status);

    *width = 0;
    tstatus = 0;
    if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
    {
          /* parse TDISPn get the display width */
          cptr = dispfmt;
          while(*cptr == ' ') /* skip leading blanks */
              cptr++;

          if (*cptr == 'A' || *cptr == 'a' ||
              *cptr == 'I' || *cptr == 'i' ||
              *cptr == 'O' || *cptr == 'o' ||
              *cptr == 'Z' || *cptr == 'z' ||
              *cptr == 'F' || *cptr == 'f' ||
              *cptr == 'E' || *cptr == 'e' ||
              *cptr == 'D' || *cptr == 'd' ||
              *cptr == 'G' || *cptr == 'g')
          {

            while(!isdigit((int) *cptr) && *cptr != '\0') /* find 1st digit */
              cptr++;

            *width = atoi(cptr);
            if (tcode >= TCOMPLEX)
              *width = (2 * (*width)) + 3;
          }
    }

    if (*width == 0)
    {
        /* no valid TDISPn keyword; use TFORMn instead */

        ffkeyn("TFORM", colnum, keyname, status);
        ffgkys(fptr, keyname, dispfmt, NULL, status);

        /* check if  column is scaled */
        ffkeyn("TSCAL", colnum, keyname, status);
        tstatus = 0;
        scaled = 0;

        if (ffgkyd(fptr, keyname, &tscale, NULL, &tstatus) == 0)
        {
            if (tscale != 1.0)
                scaled = 1;    /* yes, this is a scaled column */
        }

        if (scaled && tcode <= TSHORT)
        {
            /* scaled short integer col == float; default format is 14.6G */
            *width = 14;
        }
        else if (scaled && tcode == TLONG)
        {
            /* scaled long integer col == double; default format is 23.15G */
            *width = 23;
        }
        else if (scaled && tcode == TLONGLONG)
        {
            /* scaled long long integer col == double; default format is 23.15G */
            *width = 23;
        }

        else
        {
           ffghdt(fptr, &hdutype, status);  /* get type of table */
           if (hdutype == ASCII_TBL)
           {
              /* parse TFORMn get the display width */
              cptr = dispfmt;
              while(!isdigit((int) *cptr) && *cptr != '\0') /* find 1st digit */
                 cptr++;

              *width = atoi(cptr);
           }
           else
           {
                 /* this is a binary table */
                  if (tcode == TBIT)           /* 'X' */
                     *width = 8;
                  else if (tcode == TBYTE)     /* 'B' */
                     *width = 4;
                  else if (tcode == TSHORT)    /* 'I' */
                     *width = 6;
                  else if (tcode == TLONG)     /* 'J' */
                     *width = 11;
                  else if (tcode == TLONGLONG) /* 'K' */
                     *width = 20;
                  else if (tcode == TFLOAT)    /* 'E' */
                     *width = 14;
                  else if (tcode == TDOUBLE)   /* 'D' */
                     *width = 23;
                  else if (tcode == TCOMPLEX)  /* 'C' */
                     *width = 31;
                  else if (tcode == TDBLCOMPLEX)  /* 'M' */
                     *width = 49;
                  else if (tcode == TLOGICAL)  /* 'L' */
                     *width = 1;
                  else if (tcode == TSTRING)   /* 'A' */
                  {
		    int typecode;
		    long int repeat = 0, rwidth = 0;
		    int gstatus = 0;

		    /* Deal with possible vector string with repeat / width  by parsing
		       the TFORM=rAw keyword */
		    if (ffgtcl(fptr, colnum, &typecode, &repeat, &rwidth, &gstatus) == 0 &&
			rwidth >= 1 && rwidth < repeat) {
		      *width = rwidth;

		    } else {
		      
		      /* Hmmm, we couldn't parse the TFORM keyword by standard, so just do
			 simple parsing */
		      cptr = dispfmt;
		      while(!isdigit((int) *cptr) && *cptr != '\0') 
			cptr++;
		      
		      *width = atoi(cptr);
		    }

                    if (*width < 1)
                         *width = 1;  /* default is at least 1 column */
                  }
            }
        }
    } 
    return(*status);
}